

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O1

void __thiscall
btSpatialTransformationMatrix::transform<btSpatialMotionVector>
          (btSpatialTransformationMatrix *this,btSpatialMotionVector *inVec,
          btSpatialMotionVector *outVec,eOutputOperation outOp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (outOp == Subtract) {
    fVar1 = (inVec->m_topVec).m_floats[0];
    fVar2 = (inVec->m_topVec).m_floats[1];
    fVar3 = (inVec->m_topVec).m_floats[2];
    fVar4 = (this->m_rotMat).m_el[2].m_floats[1];
    fVar5 = (this->m_rotMat).m_el[2].m_floats[0];
    fVar13 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar6 = *(undefined8 *)(outVec->m_topVec).m_floats;
    fVar11 = (float)uVar6 -
             (fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
             fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
             (this->m_rotMat).m_el[0].m_floats[1] * fVar2);
    fVar12 = (float)((ulong)uVar6 >> 0x20) -
             (fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
             fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
             (this->m_rotMat).m_el[1].m_floats[1] * fVar2);
    *(ulong *)(outVec->m_topVec).m_floats = CONCAT44(fVar12,fVar11);
    fVar10 = (outVec->m_topVec).m_floats[2] - (fVar13 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2);
    (outVec->m_topVec).m_floats[2] = fVar10;
    fVar1 = (this->m_trnVec).m_floats[0];
    fVar2 = (inVec->m_bottomVec).m_floats[0];
    fVar3 = (inVec->m_bottomVec).m_floats[1];
    fVar4 = (inVec->m_bottomVec).m_floats[2];
    fVar5 = (this->m_rotMat).m_el[2].m_floats[1];
    fVar13 = (this->m_rotMat).m_el[2].m_floats[0];
    fVar15 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar6 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
    fVar14 = (float)uVar6;
    fVar16 = (float)((ulong)uVar6 >> 0x20);
    uVar6 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
    *(ulong *)(outVec->m_bottomVec).m_floats =
         CONCAT44((float)((ulong)uVar6 >> 0x20) -
                  ((fVar4 * (this->m_rotMat).m_el[1].m_floats[2] +
                   fVar2 * (this->m_rotMat).m_el[1].m_floats[0] +
                   (this->m_rotMat).m_el[1].m_floats[1] * fVar3) -
                  (fVar11 * fVar16 - fVar10 * fVar1)),
                  (float)uVar6 -
                  ((fVar4 * (this->m_rotMat).m_el[0].m_floats[2] +
                   fVar2 * (this->m_rotMat).m_el[0].m_floats[0] +
                   (this->m_rotMat).m_el[0].m_floats[1] * fVar3) -
                  (fVar10 * fVar14 - fVar12 * fVar16)));
    (outVec->m_bottomVec).m_floats[2] =
         (outVec->m_bottomVec).m_floats[2] -
         ((fVar15 * fVar4 + fVar13 * fVar2 + fVar5 * fVar3) - (fVar12 * fVar1 - fVar11 * fVar14));
  }
  else {
    if (outOp == Add) {
      fVar1 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (inVec->m_topVec).m_floats[2];
      fVar4 = (this->m_rotMat).m_el[2].m_floats[1];
      fVar5 = (this->m_rotMat).m_el[2].m_floats[0];
      fVar13 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar6 = *(undefined8 *)(outVec->m_topVec).m_floats;
      fVar11 = (float)uVar6 +
               fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
               (this->m_rotMat).m_el[0].m_floats[1] * fVar2;
      fVar12 = (float)((ulong)uVar6 >> 0x20) +
               fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
               (this->m_rotMat).m_el[1].m_floats[1] * fVar2;
      uVar6 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
      *(ulong *)(outVec->m_topVec).m_floats = CONCAT44(fVar12,fVar11);
      fVar10 = fVar13 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + (outVec->m_topVec).m_floats[2];
      (outVec->m_topVec).m_floats[2] = fVar10;
      fVar1 = (this->m_trnVec).m_floats[0];
      fVar2 = (inVec->m_bottomVec).m_floats[0];
      fVar3 = (inVec->m_bottomVec).m_floats[1];
      fVar4 = (inVec->m_bottomVec).m_floats[2];
      fVar5 = (this->m_rotMat).m_el[2].m_floats[1];
      fVar13 = (this->m_rotMat).m_el[2].m_floats[0];
      fVar15 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar7 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
      fVar14 = (float)uVar7;
      fVar16 = (float)((ulong)uVar7 >> 0x20);
      *(ulong *)(outVec->m_bottomVec).m_floats =
           CONCAT44(((fVar4 * (this->m_rotMat).m_el[1].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[1].m_floats[0] +
                     (this->m_rotMat).m_el[1].m_floats[1] * fVar3) -
                    (fVar11 * fVar16 - fVar10 * fVar1)) + (float)((ulong)uVar6 >> 0x20),
                    ((fVar4 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[0].m_floats[0] +
                     (this->m_rotMat).m_el[0].m_floats[1] * fVar3) -
                    (fVar10 * fVar14 - fVar12 * fVar16)) + (float)uVar6);
      (outVec->m_bottomVec).m_floats[2] =
           ((fVar15 * fVar4 + fVar13 * fVar2 + fVar5 * fVar3) - (fVar12 * fVar1 - fVar11 * fVar14))
           + (outVec->m_bottomVec).m_floats[2];
      return;
    }
    if (outOp == None) {
      fVar1 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (inVec->m_topVec).m_floats[2];
      auVar9._4_4_ = fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
                     fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
                     (this->m_rotMat).m_el[1].m_floats[1] * fVar2;
      auVar9._0_4_ = fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
                     (this->m_rotMat).m_el[0].m_floats[1] * fVar2;
      auVar9._8_4_ = fVar3 * (this->m_rotMat).m_el[2].m_floats[2] +
                     fVar1 * (this->m_rotMat).m_el[2].m_floats[0] +
                     fVar2 * (this->m_rotMat).m_el[2].m_floats[1];
      auVar9._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_topVec).m_floats = auVar9;
      fVar1 = (outVec->m_topVec).m_floats[0];
      fVar2 = (this->m_trnVec).m_floats[0];
      fVar3 = (inVec->m_bottomVec).m_floats[0];
      fVar4 = (inVec->m_bottomVec).m_floats[1];
      fVar5 = (inVec->m_bottomVec).m_floats[2];
      uVar6 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
      uVar7 = *(undefined8 *)((outVec->m_topVec).m_floats + 1);
      fVar13 = (float)uVar6;
      fVar15 = (float)((ulong)uVar6 >> 0x20);
      fVar10 = (float)uVar7;
      fVar11 = (float)((ulong)uVar7 >> 0x20);
      auVar8._4_4_ = (fVar5 * (this->m_rotMat).m_el[1].m_floats[2] +
                     fVar3 * (this->m_rotMat).m_el[1].m_floats[0] +
                     (this->m_rotMat).m_el[1].m_floats[1] * fVar4) -
                     (fVar1 * fVar15 - fVar2 * fVar11);
      auVar8._0_4_ = (fVar5 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar3 * (this->m_rotMat).m_el[0].m_floats[0] +
                     (this->m_rotMat).m_el[0].m_floats[1] * fVar4) -
                     (fVar11 * fVar13 - fVar15 * fVar10);
      auVar8._8_4_ = ((this->m_rotMat).m_el[2].m_floats[2] * fVar5 +
                     (this->m_rotMat).m_el[2].m_floats[0] * fVar3 +
                     (this->m_rotMat).m_el[2].m_floats[1] * fVar4) -
                     (fVar2 * fVar10 - fVar1 * fVar13);
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_bottomVec).m_floats = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void transform(	const SpatialVectorType &inVec,
                      SpatialVectorType &outVec,
					eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec = -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec += -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec -= -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		
	}